

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

int get_floor_type(char c)

{
  char cVar1;
  int local_10;
  int val;
  char c_local;
  
  cVar1 = what_map_char(c);
  local_10 = (int)cVar1;
  if (local_10 == 0x7f) {
    local_10 = -1;
    lc_warning("Invalid fill character \'%c\' in MAZE declaration",(ulong)(uint)(int)c);
  }
  return local_10;
}

Assistant:

int get_floor_type(char c)
{
	int val;

	val = what_map_char(c);
	if (val == INVALID_TYPE) {
	    val = ERR;
	    lc_warning("Invalid fill character '%c' in MAZE declaration", c);
	}
	return val;
}